

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

char * utf8_decode(char *s,utfint *val,int strict)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  utfint *puVar5;
  uint uVar6;
  
  bVar1 = *s;
  uVar3 = (uint)bVar1;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    puVar5 = utf8_decode::limits;
    bVar1 = 0;
    uVar4 = 0;
    uVar6 = 0;
    for (; (uVar3 & 0x40) != 0; uVar3 = uVar3 * 2) {
      if (((byte)s[uVar4 + 1] & 0xffffffc0) != 0x80) {
        return (char *)0x0;
      }
      uVar6 = uVar6 << 6 | (byte)s[uVar4 + 1] & 0x3f;
      puVar5 = puVar5 + 1;
      bVar1 = bVar1 + 5;
      uVar4 = uVar4 + 1;
    }
    if (5 < uVar4) {
      return (char *)0x0;
    }
    uVar6 = (uVar3 & 0x3f) << (bVar1 & 0x1f) | uVar6;
    if ((int)uVar6 < 0) {
      return (char *)0x0;
    }
    if (uVar6 < *puVar5) {
      return (char *)0x0;
    }
    s = s + uVar4;
  }
  if ((strict == 0) || ((uVar6 & 0x1ff800) != 0xd800 && uVar6 < 0x110000)) {
    if (val != (utfint *)0x0) {
      *val = uVar6;
    }
    pcVar2 = s + 1;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static const char *utf8_decode (const char *s, utfint *val, int strict) {
  static const utfint limits[] =
        {~(utfint)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  utfint res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if (!iscont(cc))  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((utfint)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}